

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ShuffleTests(UnitTestImpl *this)

{
  int iVar1;
  TestSuite *this_00;
  bool bVar2;
  Random *pRVar3;
  size_type sVar4;
  reference ppTVar5;
  TestSuite **test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  UnitTestImpl *this_local;
  
  pRVar3 = (Random *)random(this);
  ShuffleRange<int>(pRVar3,0,this->last_death_test_suite_ + 1,&this->test_suite_indices_);
  pRVar3 = (Random *)random(this);
  iVar1 = this->last_death_test_suite_;
  sVar4 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::size
                    (&this->test_suites_);
  ShuffleRange<int>(pRVar3,iVar1 + 1,(int)sVar4,&this->test_suite_indices_);
  __end2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                     (&this->test_suites_);
  test_suite = (TestSuite **)
               std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                         (&this->test_suites_);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                      (&__end2,(__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                                *)&test_suite);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppTVar5 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppTVar5;
    pRVar3 = (Random *)random(this);
    TestSuite::ShuffleTests(this_00,pRVar3);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void UnitTestImpl::ShuffleTests() {
  // Shuffles the death test suites.
  ShuffleRange(random(), 0, last_death_test_suite_ + 1, &test_suite_indices_);

  // Shuffles the non-death test suites.
  ShuffleRange(random(), last_death_test_suite_ + 1,
               static_cast<int>(test_suites_.size()), &test_suite_indices_);

  // Shuffles the tests inside each test suite.
  for (auto& test_suite : test_suites_) {
    test_suite->ShuffleTests(random());
  }
}